

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

ssize_t __thiscall
zmq::multipart_t::send(multipart_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  size_t sVar2;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  size_t local_78 [2];
  undefined1 local_68 [8];
  message_t message;
  bool more;
  int flags_local;
  multipart_t *this_local;
  socket_ref socket_local;
  
  this_local = (multipart_t *)CONCAT44(in_register_00000034,__fd);
  message.msg._._60_4_ = (uint)__buf & 0xfffffffd;
  sVar2 = size(this);
  message.msg._[0x3b] = sVar2 != 0;
  do {
    if ((message.msg._[0x3b] & 1) == 0) {
      clear(this);
      socket_local.super_socket_base._handle._7_1_ = 1;
      uVar3 = extraout_RAX;
      break;
    }
    pop((message_t *)local_68,this);
    sVar2 = size(this);
    message.msg._[0x3b] = sVar2 != 0;
    __n = detail::socket_base::send
                    ((socket_base *)&this_local,(int)(message_t *)local_68,
                     (void *)(ulong)((uint)message.msg._[0x3b] * 2 | message.msg._._60_4_),__n,
                     __flags);
    local_78[0] = __n;
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_78);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      socket_local.super_socket_base._handle._7_1_ = 0;
    }
    message_t::~message_t((message_t *)local_68);
    uVar3 = 0;
  } while (!bVar1);
  return CONCAT71((int7)((ulong)uVar3 >> 8),socket_local.super_socket_base._handle._7_1_) &
         0xffffffffffffff01;
}

Assistant:

bool send(socket_ref socket, int flags = 0)
    {
        flags &= ~(ZMQ_SNDMORE);
        bool more = size() > 0;
        while (more) {
            message_t message = pop();
            more = size() > 0;
#ifdef ZMQ_CPP11
            if (!socket.send(message, static_cast<send_flags>(
                                        (more ? ZMQ_SNDMORE : 0) | flags)))
                return false;
#else
            if (!socket.send(message, (more ? ZMQ_SNDMORE : 0) | flags))
                return false;
#endif
        }
        clear();
        return true;
    }